

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

VARR_token_t * do_concat(c2m_ctx_t c2m_ctx,VARR_token_t *tokens)

{
  short sVar1;
  short sVar2;
  undefined8 uVar3;
  int iVar4;
  token_t ptVar5;
  token_t ptVar6;
  char *str;
  token_t ptVar7;
  stream_t psVar8;
  size_t ix;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  ulong local_58;
  ulong local_50;
  
  local_58 = VARR_token_tlength(tokens);
  local_50 = local_58;
  do {
    iVar15 = 2;
    lVar11 = -1;
    iVar12 = -1;
    iVar17 = 0;
    iVar14 = 0;
    do {
      iVar4 = (int)local_58;
      if (iVar4 + iVar17 < 1) {
        uVar16 = local_50 & 0xffffffff;
        while (0 < (int)uVar16) {
          uVar16 = uVar16 - 1;
          ptVar5 = VARR_token_tget(tokens,uVar16);
          *(undefined2 *)&ptVar5->field_0x2 = 1;
        }
        return tokens;
      }
      ptVar5 = VARR_token_tget(tokens,(ulong)(uint)(iVar4 + iVar12));
      lVar11 = lVar11 + 1;
      iVar15 = iVar15 + 1;
      iVar14 = iVar14 + 1;
      iVar12 = iVar12 + -1;
      iVar17 = iVar17 + -1;
    } while (*(short *)ptVar5 != 0x142);
    if ((iVar4 == iVar14) || (ix = (local_58 & 0xffffffff) - lVar11, (int)(uint)local_50 <= (int)ix)
       ) {
      __assert_fail("k >= 0 && j < len",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0xaa9,"VARR_token_t *do_concat(c2m_ctx_t, VARR_token_t *)");
    }
    ptVar6 = VARR_token_tget(tokens,ix);
    if ((*(short *)ptVar6 == 0x20) || (ptVar6 = VARR_token_tget(tokens,ix), *(short *)ptVar6 == 10))
    {
      ix = (size_t)((iVar4 - iVar14) + 2);
    }
    uVar10 = (uint)ix;
    uVar13 = iVar12 + iVar4;
    ptVar6 = VARR_token_tget(tokens,(ulong)uVar13);
    if ((*(short *)ptVar6 == 0x20) ||
       (ptVar6 = VARR_token_tget(tokens,(ulong)uVar13), *(short *)ptVar6 == 10)) {
      uVar13 = iVar4 - iVar15;
    }
    local_58 = (ulong)uVar13;
    if (((int)uVar13 < 0) || ((uint)local_50 <= uVar10)) {
      __assert_fail("k >= 0 && j < len",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0xaae,"VARR_token_t *do_concat(c2m_ctx_t, VARR_token_t *)");
    }
    ptVar6 = VARR_token_tget(tokens,ix & 0xffffffff);
    sVar1 = *(short *)ptVar6;
    ptVar6 = VARR_token_tget(tokens,local_58);
    sVar2 = *(short *)ptVar6;
    if ((sVar1 == 0x141) || (sVar2 == 0x141)) {
      if (sVar1 == 0x141) {
        uVar9 = uVar10 + 1;
        if (uVar9 < (uint)local_50) {
          ptVar6 = VARR_token_tget(tokens,(ulong)uVar9);
          if ((*(short *)ptVar6 == 0x20) ||
             (ptVar6 = VARR_token_tget(tokens,(ulong)uVar9), *(short *)ptVar6 == 10)) {
            uVar10 = uVar9;
          }
        }
      }
      else {
        uVar10 = uVar10 - 1;
      }
      if (sVar2 == 0x141) {
        if (uVar13 == 0) {
          local_58 = 0;
        }
        else {
          uVar16 = (ulong)(uVar13 - 1);
          ptVar6 = VARR_token_tget(tokens,uVar16);
          if ((*(short *)ptVar6 == 0x20) ||
             (ptVar6 = VARR_token_tget(tokens,uVar16), *(short *)ptVar6 == 10)) {
            local_58 = uVar16;
          }
        }
        if (sVar1 == 0x141) {
          del_tokens(tokens,(int)local_58,uVar10 - (int)local_58);
          ptVar5 = new_token(c2m_ctx,ptVar5->pos,"",0x20,N_IGNORE);
          VARR_token_tset(tokens,local_58,ptVar5);
          goto LAB_00161dc2;
        }
      }
      else {
        local_58 = (ulong)(uVar13 + 1);
      }
      del_tokens(tokens,(int)local_58,(uVar10 - (int)local_58) + 1);
    }
    else {
      ptVar5 = VARR_token_tget(tokens,local_58);
      ptVar6 = VARR_token_tget(tokens,ix & 0xffffffff);
      VARR_chartrunc(c2m_ctx->temp_string,0);
      add_to_temp_string(c2m_ctx,ptVar5->repr);
      add_to_temp_string(c2m_ctx,ptVar6->repr);
      reverse(c2m_ctx->temp_string);
      str = VARR_charaddr(c2m_ctx->temp_string);
      set_string_stream(c2m_ctx,str,ptVar5->pos,(_func_void_char_ptr_VARR_char_ptr *)0x0);
      ptVar6 = get_next_pptoken(c2m_ctx);
      do {
        ptVar7 = get_next_pptoken(c2m_ctx);
      } while (*(short *)ptVar7 == 0x147);
      if (*(short *)ptVar7 != 0x13d) {
        reverse(c2m_ctx->temp_string);
        uVar3._0_4_ = (ptVar5->pos).lno;
        uVar3._4_4_ = (ptVar5->pos).ln_pos;
        error(c2m_ctx,0x18e763,(ptVar5->pos).fname,uVar3);
        if (c2m_ctx->cs->f != (FILE *)0x0) {
          __assert_fail("cs->f == NULL && cs->f == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x42a,"void remove_string_stream(c2m_ctx_t)");
        }
        psVar8 = VARR_stream_tpop(c2m_ctx->streams);
        free_stream(psVar8);
        psVar8 = VARR_stream_tlast(c2m_ctx->streams);
        c2m_ctx->cs = psVar8;
      }
      del_tokens(tokens,uVar13 + 1,uVar10 - uVar13);
      VARR_token_tset(tokens,local_58,ptVar6);
    }
LAB_00161dc2:
    local_50 = VARR_token_tlength(tokens);
  } while( true );
}

Assistant:

static VARR (token_t) * do_concat (c2m_ctx_t c2m_ctx, VARR (token_t) * tokens) {
  int i, j, k, empty_j_p, empty_k_p, len = (int) VARR_LENGTH (token_t, tokens);
  token_t t;

  for (i = len - 1; i >= 0; i--)
    if ((t = VARR_GET (token_t, tokens, i))->code == T_RDBLNO) {
      j = i + 1;
      k = i - 1;
      assert (k >= 0 && j < len);
      if (VARR_GET (token_t, tokens, j)->code == ' ' || VARR_GET (token_t, tokens, j)->code == '\n')
        j++;
      if (VARR_GET (token_t, tokens, k)->code == ' ' || VARR_GET (token_t, tokens, k)->code == '\n')
        k--;
      assert (k >= 0 && j < len);
      empty_j_p = VARR_GET (token_t, tokens, j)->code == T_PLM;
      empty_k_p = VARR_GET (token_t, tokens, k)->code == T_PLM;
      if (empty_j_p || empty_k_p) {
        if (!empty_j_p)
          j--;
        else if (j + 1 < len
                 && (VARR_GET (token_t, tokens, j + 1)->code == ' '
                     || VARR_GET (token_t, tokens, j + 1)->code == '\n'))
          j++;
        if (!empty_k_p)
          k++;
        else if (k != 0
                 && (VARR_GET (token_t, tokens, k - 1)->code == ' '
                     || VARR_GET (token_t, tokens, k - 1)->code == '\n'))
          k--;
        if (!empty_j_p || !empty_k_p) {
          del_tokens (tokens, k, j - k + 1);
        } else {
          del_tokens (tokens, k, j - k);
          t = new_token (c2m_ctx, t->pos, "", ' ', N_IGNORE);
          VARR_SET (token_t, tokens, k, t);
        }
      } else {
        t = token_concat (c2m_ctx, VARR_GET (token_t, tokens, k), VARR_GET (token_t, tokens, j));
        del_tokens (tokens, k + 1, j - k);
        VARR_SET (token_t, tokens, k, t);
      }
      i = k;
      len = (int) VARR_LENGTH (token_t, tokens);
    }
  for (i = len - 1; i >= 0; i--) VARR_GET (token_t, tokens, i)->processed_p = TRUE;
  return tokens;
}